

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexCubeShader::shadeFragments
          (TexCubeShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  const_reference pvVar1;
  float fVar2;
  Vector<float,_4> *local_130;
  float *local_110;
  int local_104;
  undefined8 uStack_100;
  int fragNdx_1;
  float local_f8;
  Vector<float,_3> local_f4;
  Vector<float,_3> local_e8;
  Vector<float,_3> local_dc;
  Vector<float,_3> local_d0;
  Vector<float,_3> local_c4;
  float local_b8;
  float local_b4;
  float y;
  float x;
  Vec4 coord;
  int fragNdx;
  int packetNdx;
  Vec4 colors [4];
  Vec3 texCoords [4];
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  TexCubeShader *this_local;
  
  local_110 = colors[3].m_data + 2;
  texCoords[3].m_data._4_8_ = context;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_110);
    local_110 = local_110 + 3;
  } while (local_110 != texCoords[3].m_data + 1);
  local_130 = (Vector<float,_4> *)&fragNdx;
  do {
    tcu::Vector<float,_4>::Vector(local_130);
    local_130 = local_130 + 1;
  } while (local_130 != (Vector<float,_4> *)(colors[3].m_data + 2));
  for (coord.m_data[3] = 0.0; (int)coord.m_data[3] < numPackets;
      coord.m_data[3] = (float)((int)coord.m_data[3] + 1)) {
    for (coord.m_data[2] = 0.0; (int)coord.m_data[2] < 4;
        coord.m_data[2] = (float)((int)coord.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)&y,packets + (int)coord.m_data[3],
                 (FragmentShadingContext *)texCoords[3].m_data._4_8_,0,(int)coord.m_data[2]);
      fVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&y);
      local_b4 = fVar2 + fVar2 + -1.0;
      fVar2 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&y);
      local_b8 = fVar2 + fVar2 + -1.0;
      switch(*(undefined4 *)&(this->super_ShaderProgram).field_0x154) {
      case 0:
        tcu::Vector<float,_3>::Vector(&local_c4,-1.0,-local_b8,local_b4);
        *(undefined8 *)(texCoords[(long)(int)coord.m_data[2] + -1].m_data + 1) =
             local_c4.m_data._0_8_;
        texCoords[(int)coord.m_data[2]].m_data[0] = local_c4.m_data[2];
        break;
      case 1:
        tcu::Vector<float,_3>::Vector(&local_d0,1.0,-local_b8,-local_b4);
        *(undefined8 *)(texCoords[(long)(int)coord.m_data[2] + -1].m_data + 1) =
             local_d0.m_data._0_8_;
        texCoords[(int)coord.m_data[2]].m_data[0] = local_d0.m_data[2];
        break;
      case 2:
        tcu::Vector<float,_3>::Vector(&local_dc,local_b4,-1.0,-local_b8);
        *(undefined8 *)(texCoords[(long)(int)coord.m_data[2] + -1].m_data + 1) =
             local_dc.m_data._0_8_;
        texCoords[(int)coord.m_data[2]].m_data[0] = local_dc.m_data[2];
        break;
      case 3:
        tcu::Vector<float,_3>::Vector(&local_e8,local_b4,1.0,local_b8);
        *(undefined8 *)(texCoords[(long)(int)coord.m_data[2] + -1].m_data + 1) =
             local_e8.m_data._0_8_;
        texCoords[(int)coord.m_data[2]].m_data[0] = local_e8.m_data[2];
        break;
      case 4:
        tcu::Vector<float,_3>::Vector(&local_f4,-local_b4,-local_b8,-1.0);
        *(undefined8 *)(texCoords[(long)(int)coord.m_data[2] + -1].m_data + 1) =
             local_f4.m_data._0_8_;
        texCoords[(int)coord.m_data[2]].m_data[0] = local_f4.m_data[2];
        break;
      case 5:
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)&stack0xffffffffffffff00,local_b4,-local_b8,1.0);
        *(undefined8 *)(texCoords[(long)(int)coord.m_data[2] + -1].m_data + 1) = uStack_100;
        texCoords[(int)coord.m_data[2]].m_data[0] = local_f8;
      }
    }
    pvVar1 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                       (&(this->super_ShaderProgram).m_uniforms,0);
    sglr::rc::TextureCube::sample4
              ((pvVar1->sampler).texCube,(Vec4 *)&fragNdx,(Vec3 *)(colors[3].m_data + 2),0.0);
    for (local_104 = 0; local_104 < 4; local_104 = local_104 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                ((FragmentShadingContext *)texCoords[3].m_data._4_8_,(int)coord.m_data[3],local_104,
                 0,(Vector<float,_4> *)(&fragNdx + (long)local_104 * 4));
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec3 texCoords[4];
		tcu::Vec4 colors[4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			// setup tex coords
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				const tcu::Vec4	coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
				const float		x		= coord.x()*2.0f - 1.0f;
				const float		y		= coord.y()*2.0f - 1.0f;

				// Swizzle tex coords
				switch (m_face)
				{
					case tcu::CUBEFACE_NEGATIVE_X:	texCoords[fragNdx] = tcu::Vec3(-1.0f,    -y,    +x);		break;
					case tcu::CUBEFACE_POSITIVE_X:	texCoords[fragNdx] = tcu::Vec3(+1.0f,    -y,    -x);		break;
					case tcu::CUBEFACE_NEGATIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, -1.0f,    -y);		break;
					case tcu::CUBEFACE_POSITIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, +1.0f,    +y);		break;
					case tcu::CUBEFACE_NEGATIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   -x,    -y, -1.0f);		break;
					case tcu::CUBEFACE_POSITIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   +x,    -y, +1.0f);		break;
					default:
						DE_ASSERT(false);
				}
			}

			// Sample
			m_uniforms[0].sampler.texCube->sample4(colors, texCoords);

			// Write out
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, colors[fragNdx]);
		}
	}